

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_20::NameGenerator::GenerateAndBindName
          (NameGenerator *this,BindingHash *bindings,char *prefix,Index index,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  char *this_00;
  bool bVar1;
  Binding local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_40;
  uint local_34;
  string *psStack_30;
  uint disambiguator;
  string *str_local;
  char *pcStack_20;
  Index index_local;
  char *prefix_local;
  BindingHash *bindings_local;
  NameGenerator *this_local;
  
  local_34 = 0;
  psStack_30 = str;
  str_local._4_4_ = index;
  pcStack_20 = prefix;
  prefix_local = (char *)bindings;
  bindings_local = (BindingHash *)this;
  while( true ) {
    GenerateName(this,pcStack_20,str_local._4_4_,local_34,psStack_30);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
         ::find((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                 *)prefix_local,psStack_30);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
         ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                *)prefix_local);
    bVar1 = std::__detail::operator==(&local_40,&local_48);
    this_00 = prefix_local;
    __args = psStack_30;
    if (bVar1) break;
    local_34 = local_34 + 1;
  }
  Binding::Binding(&local_70,str_local._4_4_);
  std::
  unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
  ::emplace<std::__cxx11::string&,wabt::Binding>
            ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
              *)this_00,__args,&local_70);
  return;
}

Assistant:

void NameGenerator::GenerateAndBindName(BindingHash* bindings,
                                        const char* prefix,
                                        Index index,
                                        std::string* str) {
  unsigned disambiguator = 0;
  while (true) {
    GenerateName(prefix, index, disambiguator, str);
    if (bindings->find(*str) == bindings->end()) {
      bindings->emplace(*str, Binding(index));
      break;
    }

    disambiguator++;
  }
}